

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_relation.cpp
# Opt level: O2

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::ValueRelation::GetTableRef(ValueRelation *this)

{
  long *plVar1;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *puVar2;
  long lVar3;
  pointer pEVar4;
  reference pvVar5;
  string *__x;
  LogicalType *__x_00;
  reference __x_01;
  pointer pPVar6;
  long lVar7;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *__range2;
  long *plVar8;
  pointer *__ptr;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *this_00
  ;
  long *in_RSI;
  idx_t i;
  ulong uVar9;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  copied_list;
  __uniq_ptr_impl<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>_>
  local_78;
  long *local_70;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_68;
  __uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_> local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  
  local_60._M_t.super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl =
       (tuple<duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)
       (tuple<duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)this;
  make_uniq<duckdb::ExpressionListRef>();
  lVar7 = in_RSI[0x13];
  lVar3 = in_RSI[0x14];
  local_70 = in_RSI;
  if (lVar7 == lVar3) {
    for (uVar9 = 0; uVar9 < (ulong)(local_70[0x11] - local_70[0x10] >> 5); uVar9 = uVar9 + 1) {
      pEVar4 = unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
               ::operator->((unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
                             *)&local_78);
      __x_01 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            *)(in_RSI + 0x10),uVar9);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&pEVar4->expected_names,__x_01);
    }
  }
  else {
    for (uVar9 = 0; uVar9 < (ulong)((lVar3 - lVar7) / 0xd8); uVar9 = uVar9 + 1) {
      pEVar4 = unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
               ::operator->((unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
                             *)&local_78);
      pvVar5 = vector<duckdb::ColumnDefinition,_true>::get<true>
                         ((vector<duckdb::ColumnDefinition,_true> *)(in_RSI + 0x13),uVar9);
      __x = ColumnDefinition::Name_abi_cxx11_(pvVar5);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&pEVar4->expected_names,__x);
      pEVar4 = unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
               ::operator->((unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
                             *)&local_78);
      pvVar5 = vector<duckdb::ColumnDefinition,_true>::get<true>
                         ((vector<duckdb::ColumnDefinition,_true> *)(in_RSI + 0x13),uVar9);
      __x_00 = ColumnDefinition::Type(pvVar5);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&(pEVar4->expected_types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__x_00);
      lVar7 = local_70[0x13];
      lVar3 = local_70[0x14];
    }
  }
  plVar1 = (long *)local_70[0xe];
  for (plVar8 = (long *)local_70[0xd]; plVar8 != plVar1; plVar8 = plVar8 + 3) {
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::reserve((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               *)&local_58,plVar8[1] - *plVar8 >> 3);
    puVar2 = (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)plVar8[1];
    for (this_00 = (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)*plVar8; this_00 != puVar2; this_00 = this_00 + 1) {
      pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(this_00);
      (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_68,pPVar6);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&local_58,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_68);
      if (local_68._M_head_impl != (ParsedExpression *)0x0) {
        (*((local_68._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
    }
    pEVar4 = unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
             ::operator->((unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
                           *)&local_78);
    ::std::
    vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>>
    ::
    emplace_back<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>>
                *)&pEVar4->values,
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)&local_58);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               *)&local_58);
  }
  (**(code **)(*local_70 + 0x28))(&local_58);
  pEVar4 = unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
           ::operator->((unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
                         *)&local_78);
  ::std::__cxx11::string::operator=((string *)&(pEVar4->super_TableRef).alias,(string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_58);
  *(tuple<duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_> *)
   local_60._M_t.super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
   super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl =
       local_78._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionListRef_*,_std::default_delete<duckdb::ExpressionListRef>_>
       .super__Head_base<0UL,_duckdb::ExpressionListRef_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (_Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)
         local_60._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<TableRef> ValueRelation::GetTableRef() {
	auto table_ref = make_uniq<ExpressionListRef>();
	// set the expected types/names
	if (columns.empty()) {
		// no columns yet: only set up names
		for (idx_t i = 0; i < names.size(); i++) {
			table_ref->expected_names.push_back(names[i]);
		}
	} else {
		for (idx_t i = 0; i < columns.size(); i++) {
			table_ref->expected_names.push_back(columns[i].Name());
			table_ref->expected_types.push_back(columns[i].Type());
			D_ASSERT(names.size() == 0 || columns[i].Name() == names[i]);
		}
	}
	// copy the expressions
	for (auto &expr_list : expressions) {
		vector<unique_ptr<ParsedExpression>> copied_list;
		copied_list.reserve(expr_list.size());
		for (auto &expr : expr_list) {
			copied_list.push_back(expr->Copy());
		}
		table_ref->values.push_back(std::move(copied_list));
	}
	table_ref->alias = GetAlias();
	return std::move(table_ref);
}